

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
                  *this,vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                        *container,MatchResultListener *listener)

{
  string *psVar1;
  pointer pMVar2;
  bool bVar3;
  bool bVar4;
  size_t __n;
  MatcherBase<const_prometheus::ClientMetric::Label_&> *pMVar5;
  reference pLVar6;
  pointer pMVar7;
  MatchResultListener *pMVar8;
  reference pvVar9;
  ostream *os;
  string *psVar10;
  ulong uVar11;
  string *s_1;
  size_t i;
  undefined1 local_260 [3];
  bool reason_printed;
  __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
  local_258;
  pointer local_250;
  size_t actual_count;
  undefined1 local_228 [8];
  StringMatchResultListener s;
  const_iterator cStack_88;
  bool match;
  byte local_79;
  pointer pMStack_78;
  bool mismatch_found;
  size_t exam_pos;
  const_iterator it;
  StlContainerReference stl_container;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_49;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  bool listener_interested;
  MatchResultListener *listener_local;
  vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
  *container_local;
  ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
  *this_local;
  
  explanations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
       MatchResultListener::IsInterested(listener);
  __n = count(this);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48,__n,&local_49);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_49);
  it._M_current =
       (Label *)StlContainerView<std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                ::ConstReference(container);
  exam_pos = (size_t)std::
                     vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                     ::begin((vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                              *)it._M_current);
  pMStack_78 = (pointer)0x0;
  local_79 = 0;
  while( true ) {
    cStack_88 = std::
                vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                ::end(it._M_current);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                        *)&exam_pos,&stack0xffffffffffffff78);
    pMVar2 = pMStack_78;
    bVar4 = false;
    if (bVar3) {
      pMVar7 = (pointer)count(this);
      bVar4 = pMVar2 != pMVar7;
    }
    if (!bVar4) goto LAB_0014ae22;
    if ((explanations.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      pMVar5 = &std::
                vector<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                ::operator[](&this->matchers_,(size_type)pMStack_78)->
                super_MatcherBase<const_prometheus::ClientMetric::Label_&>;
      pLVar6 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
               ::operator*((__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                            *)&exam_pos);
      s._407_1_ = MatcherBase<const_prometheus::ClientMetric::Label_&>::Matches(pMVar5,pLVar6);
    }
    else {
      StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_228);
      pMVar5 = &std::
                vector<testing::Matcher<const_prometheus::ClientMetric::Label_&>,_std::allocator<testing::Matcher<const_prometheus::ClientMetric::Label_&>_>_>
                ::operator[](&this->matchers_,(size_type)pMStack_78)->
                super_MatcherBase<const_prometheus::ClientMetric::Label_&>;
      pLVar6 = __gnu_cxx::
               __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
               ::operator*((__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                            *)&exam_pos);
      s._407_1_ = MatcherBase<const_prometheus::ClientMetric::Label_&>::MatchAndExplain
                            (pMVar5,pLVar6,(MatchResultListener *)local_228);
      StringMatchResultListener::str_abi_cxx11_
                ((string *)&actual_count,(StringMatchResultListener *)local_228);
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_48,(size_type)pMStack_78);
      std::__cxx11::string::operator=((string *)pvVar9,(string *)&actual_count);
      std::__cxx11::string::~string((string *)&actual_count);
      StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_228);
    }
    if ((s._407_1_ & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
    ::operator++((__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                  *)&exam_pos);
    pMStack_78 = (pointer)((long)&(pMStack_78->
                                  super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                                  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                          1);
  }
  local_79 = 1;
LAB_0014ae22:
  local_250 = pMStack_78;
  while( true ) {
    local_258._M_current =
         (Label *)std::
                  vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  ::end(it._M_current);
    bVar4 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                        *)&exam_pos,&local_258);
    pMVar2 = local_250;
    if (!bVar4) break;
    local_250 = (pointer)((long)&(local_250->
                                 super_MatcherBase<const_prometheus::ClientMetric::Label_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 1
                         );
    __gnu_cxx::
    __normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
    ::operator++((__normal_iterator<const_prometheus::ClientMetric::Label_*,_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_>
                  *)&exam_pos);
  }
  pMVar7 = (pointer)count(this);
  if (pMVar2 == pMVar7) {
    if ((local_79 & 1) == 0) {
      if ((explanations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        i._3_1_ = 0;
        for (s_1 = (string *)0x0; psVar1 = s_1, psVar10 = (string *)count(this), psVar1 != psVar10;
            s_1 = (string *)&s_1->field_0x1) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_48,(size_type)s_1);
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) == 0) {
            if ((i._3_1_ & 1) != 0) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar8 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar8 = MatchResultListener::operator<<(pMVar8,(unsigned_long *)&s_1);
            pMVar8 = MatchResultListener::operator<<(pMVar8,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar8,pvVar9);
            i._3_1_ = 1;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      if ((explanations.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        pMVar8 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
        pMVar8 = MatchResultListener::operator<<(pMVar8,(unsigned_long *)&stack0xffffffffffffff88);
        MatchResultListener::operator<<(pMVar8,(char (*) [15])" doesn\'t match");
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_48,(size_type)pMStack_78);
        os = MatchResultListener::stream(listener);
        PrintIfNotEmpty(pvVar9,os);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (((explanations.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) &&
       (local_250 != (pointer)0x0)) {
      pMVar8 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
      Elements((ElementsAreMatcherImpl<const_std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>_&>
                *)local_260,(size_t)local_250);
      MatchResultListener::operator<<(pMVar8,(Message *)local_260);
      Message::~Message((Message *)local_260);
    }
    this_local._7_1_ = false;
  }
  i._4_4_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }